

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O2

bool stl_reader::
     ReadStlFile_ASCII<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  ulong uVar1;
  pointer pfVar2;
  pointer puVar3;
  double dVar4;
  pointer pbVar5;
  pointer pbVar6;
  int iVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  int iVar10;
  long lVar11;
  int iVar12;
  size_type __new_size;
  long local_5e0;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  string local_5b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string buffer;
  stringstream ss;
  ostream local_530 [376];
  istringstream line;
  byte abStack_398 [352];
  ifstream in;
  byte abStack_218 [488];
  
  pfVar2 = (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  puVar3 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  puVar3 = (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  std::ifstream::ifstream(&in,filename,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar8 = std::operator<<(local_530,"Couldn\'t open file ");
    std::operator<<(poVar8,filename);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&line);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = &trisOut->m_vector;
  coordsWithIndex.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coordsWithIndex.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  coordsWithIndex.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.field_2._M_local_buf[0] = '\0';
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar12 = 0;
  iVar10 = 1;
  local_5e0 = 0;
  do {
    if ((abStack_218[*(long *)(_in + -0x18)] & 7) != 0) {
      _ss = (float)(((ulong)((long)(trisOut->m_vector).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(trisOut->m_vector).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) / 3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&solidRangesOut->m_vector,(value_type_conflict3 *)&ss);
      stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
                (coordsOut,trisOut,&coordsWithIndex);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      std::__cxx11::string::~string((string *)&buffer);
      std::
      _Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ::~_Vector_base(&coordsWithIndex.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                     );
      std::ifstream::~ifstream(&in);
      return true;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&buffer)
    ;
    std::__cxx11::istringstream::istringstream((istringstream *)&line,(string *)&buffer,_S_in);
    lVar11 = 0;
    __new_size = 1;
    while (pbVar5 = tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, uVar1 = __new_size - 1,
          (abStack_398[*(long *)(_line + -0x18)] & 7) == 0) {
      if ((long)iVar12 <= (long)uVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&tokens,__new_size);
        iVar12 = (int)__new_size;
      }
      std::operator>>((istream *)&line,
                      (string *)
                      ((long)&((tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar11));
      __new_size = __new_size + 1;
      lVar11 = lVar11 + 0x20;
    }
    if (__new_size != 1) {
      iVar7 = std::__cxx11::string::compare
                        ((char *)tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      pbVar6 = tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar7 == 0) {
        if (uVar1 < 4) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar8 = std::operator<<(local_530,"ERROR while reading from ");
          poVar8 = std::operator<<(poVar8,filename);
          poVar8 = std::operator<<(poVar8,": vertex not specified correctly in line ");
          std::ostream::operator<<((ostream *)poVar8,iVar10);
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar9,local_5b8);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
          dVar4 = atof((&pbVar6[1]._M_dataplus)[lVar11]._M_p);
          *(float *)(&ss + lVar11) = (float)dVar4;
        }
        std::
        vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::push_back(&coordsWithIndex,(value_type *)&ss);
        local_5e0 = local_5e0 + 1;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar7 == 0) {
          if (uVar1 < 5) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar8 = std::operator<<(local_530,"ERROR while reading from ");
            poVar8 = std::operator<<(poVar8,filename);
            poVar8 = std::operator<<(poVar8,": triangle not specified correctly in line ");
            std::ostream::operator<<((ostream *)poVar8,iVar10);
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar9,local_5b8);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar7 = std::__cxx11::string::compare
                            ((char *)(tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          if (iVar7 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar8 = std::operator<<(local_530,"ERROR while reading from ");
            poVar8 = std::operator<<(poVar8,filename);
            poVar8 = std::operator<<(poVar8,": Missing normal specifier in line ");
            std::ostream::operator<<((ostream *)poVar8,iVar10);
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar9,local_5b8);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          for (lVar11 = 0; lVar11 != 0x60; lVar11 = lVar11 + 0x20) {
            dVar4 = atof(*(char **)((long)&tokens.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus.
                                           _M_p + lVar11));
            _ss = (float)dVar4;
            std::vector<float,_std::allocator<float>_>::push_back
                      (&normalsOut->m_vector,(value_type_conflict *)&ss);
          }
          local_5e0 = 0;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar5);
          if (iVar7 == 0) {
            if ((__new_size == 2) ||
               (iVar7 = std::__cxx11::string::compare
                                  ((char *)(tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1)),
               iVar7 != 0)) {
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              poVar8 = std::operator<<(local_530,"ERROR while reading from ");
              poVar8 = std::operator<<(poVar8,filename);
              poVar8 = std::operator<<(poVar8,": expecting outer loop in line ");
              std::ostream::operator<<((ostream *)poVar8,iVar10);
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar9,local_5b8);
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar5);
            if (iVar7 == 0) {
              if (local_5e0 != 3) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                poVar8 = std::operator<<(local_530,"ERROR while reading from ");
                poVar8 = std::operator<<(poVar8,filename);
                poVar8 = std::operator<<(poVar8,
                                         ": bad number of vertices specified for face in line ");
                std::ostream::operator<<((ostream *)poVar8,iVar10);
                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar9,local_5b8);
                __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)coordsWithIndex.
                                               super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -3
                           );
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,(value_type_conflict3 *)&ss);
              _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)coordsWithIndex.
                                               super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2
                           );
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,(value_type_conflict3 *)&ss);
              _ss = (float)((int)((ulong)((long)coordsWithIndex.
                                                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)coordsWithIndex.
                                               super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1
                           );
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,(value_type_conflict3 *)&ss);
              local_5e0 = 3;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)pbVar5);
              if (iVar7 == 0) {
                _ss = (float)(((ulong)((long)(trisOut->m_vector).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(trisOut->m_vector).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                              0xffffffff) / 3);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&solidRangesOut->m_vector,(value_type_conflict3 *)&ss);
              }
            }
          }
        }
      }
    }
    iVar10 = iVar10 + 1;
    std::__cxx11::istringstream::~istringstream((istringstream *)&line);
  } while( true );
}

Assistant:

bool ReadStlFile_ASCII(const char* filename,
                       TNumberContainer1& coordsOut,
                       TNumberContainer2& normalsOut,
                       TIndexContainer1& trisOut,
					   TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldn't open file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	string buffer;
	vector<string> tokens;
	int lineCount = 1;
	int maxNumTokens = 0;
	size_t numFaceVrts = 0;

	while(!(in.eof() || in.fail()))
	{
	//	read the line and tokenize.
	//	In order to reuse memory in between lines, 'tokens' won't be cleared.
	//	Instead we count the number of tokens using 'tokenCount'.
		getline(in, buffer);

		istringstream line(buffer);
		int tokenCount = 0;
		while(!(line.eof() || line.fail())){
			if(tokenCount >= maxNumTokens){
				maxNumTokens = tokenCount + 1;
				tokens.resize(maxNumTokens);
			}
			line >> tokens[tokenCount];
			++tokenCount;
		}

		if(tokenCount > 0)
		{
			string& tok = tokens[0];
			if(tok.compare("vertex") == 0){
				if(tokenCount < 4){
					STL_READER_THROW("ERROR while reading from " << filename <<
						": vertex not specified correctly in line " << lineCount);
				}
				
			//	read the position
				CoordWithIndex <number_t, index_t> c;
				for(size_t i = 0; i < 3; ++i)
					c[i] = static_cast<number_t> (atof(tokens[i+1].c_str()));
				c.index = static_cast<index_t>(coordsWithIndex.size());
				coordsWithIndex.push_back(c);
				++numFaceVrts;
			}
			else if(tok.compare("facet") == 0)
			{
				STL_READER_COND_THROW(tokenCount < 5,
						"ERROR while reading from " << filename <<
						": triangle not specified correctly in line " << lineCount);
				
				STL_READER_COND_THROW(tokens[1].compare("normal") != 0,
						"ERROR while reading from " << filename <<
						": Missing normal specifier in line " << lineCount);
				
			//	read the normal
				for(size_t i = 0; i < 3; ++i)
					normalsOut.push_back (static_cast<number_t> (atof(tokens[i+2].c_str())));

				numFaceVrts = 0;
			}
			else if(tok.compare("outer") == 0){
				STL_READER_COND_THROW ((tokenCount < 2) || (tokens[1].compare("loop") != 0),
				    "ERROR while reading from " << filename <<
					": expecting outer loop in line " << lineCount);
			}
			else if(tok.compare("endfacet") == 0){
				STL_READER_COND_THROW(numFaceVrts != 3,
					"ERROR while reading from " << filename <<
					": bad number of vertices specified for face in line " << lineCount);

				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));
			}
			else if(tok.compare("solid") == 0){
				solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));
			}
		}
		lineCount++;
	}

	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}